

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O0

void absl::lts_20250127::RemoveExtraAsciiWhitespace(Nonnull<std::string_*> str)

{
  string_view str_00;
  char *pcVar1;
  bool bVar2;
  const_iterator pvVar3;
  long lVar4;
  bool local_49;
  value_type *pvStack_48;
  bool is_ws;
  value_type *output_it;
  const_iterator input_end;
  const_iterator input_it;
  undefined1 local_20 [8];
  string_view stripped;
  Nonnull<std::string_*> str_local;
  
  stripped._M_str = (char *)str;
  str_00 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)str);
  _local_20 = StripAsciiWhitespace(str_00);
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  if (bVar2) {
    std::__cxx11::string::clear();
  }
  else {
    input_end = std::basic_string_view<char,_std::char_traits<char>_>::begin
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                       ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
    pvStack_48 = (value_type *)std::__cxx11::string::operator[]((ulong)stripped._M_str);
    local_49 = false;
    for (; pcVar1 = stripped._M_str, input_end < pvVar3; input_end = input_end + 1) {
      if (local_49 == false) {
        local_49 = ascii_isspace(*input_end);
      }
      else {
        local_49 = ascii_isspace(*input_end);
        if (local_49) {
          pvStack_48 = pvStack_48 + -1;
        }
      }
      *pvStack_48 = *input_end;
      pvStack_48 = pvStack_48 + 1;
    }
    lVar4 = std::__cxx11::string::operator[]((ulong)stripped._M_str);
    std::__cxx11::string::erase((ulong)pcVar1,(long)pvStack_48 - lVar4);
  }
  return;
}

Assistant:

void RemoveExtraAsciiWhitespace(absl::Nonnull<std::string*> str) {
  auto stripped = StripAsciiWhitespace(*str);

  if (stripped.empty()) {
    str->clear();
    return;
  }

  auto input_it = stripped.begin();
  auto input_end = stripped.end();
  auto output_it = &(*str)[0];
  bool is_ws = false;

  for (; input_it < input_end; ++input_it) {
    if (is_ws) {
      // Consecutive whitespace?  Keep only the last.
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
      if (is_ws) --output_it;
    } else {
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
    }

    *output_it = *input_it;
    ++output_it;
  }

  str->erase(static_cast<size_t>(output_it - &(*str)[0]));
}